

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.h
# Opt level: O2

void __thiscall Pool::Pool(Pool *this,string *name,int depth)

{
  _Rb_tree_header *p_Var1;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  this->current_use_ = 0;
  this->depth_ = depth;
  (this->delayed_)._M_t._M_impl.super__Rb_tree_key_compare<bool_(*)(const_Edge_*,_const_Edge_*)>.
  _M_key_compare = WeightedEdgeCmp;
  p_Var1 = &(this->delayed_)._M_t._M_impl.super__Rb_tree_header;
  (this->delayed_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->delayed_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->delayed_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->delayed_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->delayed_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

Pool(const std::string& name, int depth)
    : name_(name), current_use_(0), depth_(depth), delayed_(&WeightedEdgeCmp) {}